

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

Status google::protobuf::File::WriteStringToFile(string_view contents,string *name)

{
  int iVar1;
  FILE *__s;
  char *pcVar2;
  int *piVar3;
  undefined8 *in_RCX;
  AlphaNum *in_R9;
  string_view message;
  string_view message_00;
  string_view message_01;
  string local_108;
  AlphaNum local_e8;
  AlphaNum local_b8;
  undefined8 local_88;
  char *local_80;
  AlphaNum local_58;
  
  message._M_len = (undefined8 *)contents._M_len;
  __s = fopen((char *)*in_RCX,"wb");
  if (__s == (FILE *)0x0) {
    local_88 = 6;
    local_80 = "fopen(";
    local_b8.piece_._M_str = (char *)*in_RCX;
    local_b8.piece_._M_len = in_RCX[1];
    local_e8.piece_._M_len = 9;
    local_e8.piece_._M_str = ", \"wb\"): ";
    piVar3 = __errno_location();
    local_58.piece_._M_str = strerror(*piVar3);
    if (local_58.piece_._M_str == (char *)0x0) {
      local_58.piece_._M_len = 0;
      local_58.piece_._M_str = (char *)0x0;
    }
    else {
      local_58.piece_._M_len = strlen(local_58.piece_._M_str);
    }
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_108,(lts_20250127 *)&local_88,&local_b8,&local_e8,&local_58,in_R9);
    message_00._M_str = (char *)local_108._M_string_length;
    message_00._M_len = (size_t)message._M_len;
    absl::lts_20250127::InternalError(message_00);
  }
  else {
    pcVar2 = (char *)fwrite(name,1,(size_t)contents._M_str,__s);
    iVar1 = fclose(__s);
    if (pcVar2 == contents._M_str) {
      if (iVar1 != 0) {
        message._M_str = &DAT_00000014;
        absl::lts_20250127::InternalError(message);
        return (Status)(uintptr_t)message._M_len;
      }
      *message._M_len = 1;
      return (Status)(uintptr_t)message._M_len;
    }
    local_88 = 7;
    local_80 = "fwrite(";
    local_b8.piece_._M_str = (char *)*in_RCX;
    local_b8.piece_._M_len = in_RCX[1];
    local_e8.piece_._M_len = 3;
    local_e8.piece_._M_str = "): ";
    piVar3 = __errno_location();
    local_58.piece_._M_str = strerror(*piVar3);
    if (local_58.piece_._M_str == (char *)0x0) {
      local_58.piece_._M_len = 0;
      local_58.piece_._M_str = (char *)0x0;
    }
    else {
      local_58.piece_._M_len = strlen(local_58.piece_._M_str);
    }
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_108,(lts_20250127 *)&local_88,&local_b8,&local_e8,&local_58,in_R9);
    message_01._M_str = (char *)local_108._M_string_length;
    message_01._M_len = (size_t)message._M_len;
    absl::lts_20250127::InternalError(message_01);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return (Status)(uintptr_t)message._M_len;
}

Assistant:

absl::Status File::WriteStringToFile(absl::string_view contents,
                                     const std::string& name) {
  FILE* file = fopen(name.c_str(), "wb");
  if (file == nullptr) {
    return absl::InternalError(
        absl::StrCat("fopen(", name, ", \"wb\"): ", strerror(errno)));
  }

  if (fwrite(contents.data(), 1, contents.size(), file) != contents.size()) {
    fclose(file);
    return absl::InternalError(
        absl::StrCat("fwrite(", name, "): ", strerror(errno)));
  }

  if (fclose(file) != 0) {
    return absl::InternalError("Failed to close file");
  }
  return absl::OkStatus();
}